

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yacclab_tests.cc
# Opt level: O1

void __thiscall YacclabTests::BlockSizeTest(YacclabTests *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PerformanceEvaluator::Elapsed,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PerformanceEvaluator::Elapsed>_>_>
  *this_00;
  pointer pcVar1;
  pointer pbVar2;
  GlobalConfig *pGVar3;
  undefined8 uVar4;
  pointer pdVar5;
  bool bVar6;
  char cVar7;
  path *ppVar8;
  ModeConfig *pMVar9;
  ModeConfig *pMVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  Labeling *pLVar11;
  undefined4 extraout_var;
  pointer pbVar12;
  const_iterator cVar13;
  mapped_type *pmVar14;
  long lVar15;
  long *plVar16;
  ulong uVar17;
  ostream *poVar18;
  uint uVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  size_type *psVar21;
  _Base_ptr p_Var22;
  undefined8 *puVar23;
  int iVar24;
  ulong uVar25;
  int iVar26;
  key_type *__k;
  YacclabTests *this_01;
  long lVar27;
  long lVar28;
  int iVar29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dataset;
  ulong uVar30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *algo_name;
  long lVar31;
  YacclabTests *pYVar32;
  double dVar33;
  string filename;
  path is_path;
  string dataset_name;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> dims;
  path filename_path;
  path dataset_path;
  path current_latex_path;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  header;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  filenames;
  path current_output_path;
  vector<double,_std::allocator<double>_> min_times;
  vector<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>,_std::allocator<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>_>_>
  results;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  OutputBox ob;
  string local_518;
  YacclabTests *local_4f8;
  string local_4f0;
  string local_4d0;
  ulong local_4b0;
  array<int,_3UL> *local_4a8;
  iterator iStack_4a0;
  array<int,_3UL> *local_498;
  long *local_490;
  long local_488;
  long local_480 [2];
  path local_470;
  _Base_ptr local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  path local_428;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_408;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3f0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  local_3e8;
  ulong local_3c8;
  undefined1 local_3c0 [80];
  vector<double,_std::allocator<double>_> local_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  _Alloc_hider local_348;
  ulong local_318;
  Labeling *local_310;
  undefined1 local_308 [8];
  GlobalConfig *pGStack_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8 [14];
  ios_base local_210 [304];
  OutputBox local_e0;
  
  local_308 = (undefined1  [8])local_2f8;
  pcVar1 = (this->mode_cfg_->mode)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_308,pcVar1,pcVar1 + (this->mode_cfg_->mode)._M_string_length);
  std::__cxx11::string::append((char *)local_308);
  OutputBox::OutputBox(&local_e0,(string *)local_308,0x50,2);
  if (local_308 != (undefined1  [8])local_2f8) {
    operator_delete((void *)local_308,local_2f8[0]._M_allocated_capacity + 1);
  }
  pMVar10 = this->mode_cfg_;
  local_308 = (undefined1  [8])local_2f8;
  pcVar1 = (this->glob_cfg_->glob_output_path).path_._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_308,pcVar1,
             pcVar1 + (this->glob_cfg_->glob_output_path).path_._M_string_length);
  ppVar8 = filesystem::path::operator/=((path *)local_308,&pMVar10->mode_output_path);
  local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
  pcVar1 = (ppVar8->path_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4d0,pcVar1,pcVar1 + (ppVar8->path_)._M_string_length);
  if (local_308 != (undefined1  [8])local_2f8) {
    operator_delete((void *)local_308,local_2f8[0]._M_allocated_capacity + 1);
  }
  local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,"Blocksize","");
  filesystem::path::path(&local_470,&local_4f0);
  local_308 = (undefined1  [8])local_2f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_308,local_4d0._M_dataplus._M_p,
             local_4d0._M_dataplus._M_p + local_4d0._M_string_length);
  ppVar8 = filesystem::path::operator/=((path *)local_308,&local_470);
  local_3c0._0_8_ = local_3c0 + 0x10;
  pcVar1 = (ppVar8->path_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3c0,pcVar1,pcVar1 + (ppVar8->path_)._M_string_length);
  if (local_308 != (undefined1  [8])local_2f8) {
    operator_delete((void *)local_308,local_2f8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470.path_._M_dataplus._M_p != &local_470.path_.field_2) {
    operator_delete(local_470.path_._M_dataplus._M_p,
                    local_470.path_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
  }
  local_4a8 = (array<int,_3UL> *)0x0;
  iStack_4a0._M_current = (array<int,_3UL> *)0x0;
  local_498 = (array<int,_3UL> *)0x0;
  pMVar10 = this->mode_cfg_;
  iVar24 = (pMVar10->blocksize_x)._M_elems[0];
  local_4f8 = this;
  if (iVar24 <= (pMVar10->blocksize_x)._M_elems[1]) {
    do {
      pMVar9 = this->mode_cfg_;
      for (iVar26 = (pMVar10->blocksize_y)._M_elems[0]; iVar26 <= (pMVar9->blocksize_y)._M_elems[1];
          iVar26 = iVar26 + (pMVar10->blocksize_y)._M_elems[2]) {
        iVar29 = (pMVar9->blocksize_z)._M_elems[0];
        pMVar10 = this->mode_cfg_;
        if (iVar29 <= (pMVar10->blocksize_z)._M_elems[1]) {
          do {
            if (iVar26 * iVar24 * iVar29 < 1) {
              local_308._4_4_ = iVar26;
              local_308._0_4_ = iVar24;
              pGStack_300 = (GlobalConfig *)CONCAT44(pGStack_300._4_4_,iVar29);
              if (iStack_4a0._M_current == local_498) {
                std::vector<std::array<int,3ul>,std::allocator<std::array<int,3ul>>>::
                _M_realloc_insert<std::array<int,3ul>>
                          ((vector<std::array<int,3ul>,std::allocator<std::array<int,3ul>>> *)
                           &local_4a8,iStack_4a0,(array<int,_3UL> *)local_308);
              }
              else {
                (iStack_4a0._M_current)->_M_elems[2] = iVar29;
                *(undefined1 (*) [8])(iStack_4a0._M_current)->_M_elems = local_308;
                iStack_4a0._M_current = iStack_4a0._M_current + 1;
              }
            }
            pMVar10 = local_4f8->mode_cfg_;
            iVar29 = iVar29 + (pMVar10->blocksize_z)._M_elems[2];
          } while (iVar29 <= (pMVar10->blocksize_z)._M_elems[1]);
        }
        pMVar9 = local_4f8->mode_cfg_;
        this = local_4f8;
      }
      iVar24 = iVar24 + (pMVar9->blocksize_x)._M_elems[2];
      pMVar10 = this->mode_cfg_;
    } while (iVar24 <= (pMVar10->blocksize_x)._M_elems[1]);
  }
  local_358._M_allocated_capacity = 0;
  local_358._8_8_ = 0;
  local_348._M_p = (pointer)0x0;
  local_408.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_408.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar12 = (pMVar10->ccl_blocksize_algorithms).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (pMVar10->ccl_blocksize_algorithms).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar12 != pbVar2) {
    do {
      __x = KernelMapSingleton::GetKernels(pbVar12);
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::push_back(&local_408,__x);
      pbVar12 = pbVar12 + 1;
    } while (pbVar12 != pbVar2);
  }
  if ((this->mode_cfg_->ccl_blocksize_algorithms).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->mode_cfg_->ccl_blocksize_algorithms).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    p_Var22 = (_Base_ptr)0x0;
    do {
      local_308 = (undefined1  [8])0x0;
      pGStack_300 = (GlobalConfig *)0x0;
      local_2f8[0]._M_allocated_capacity = 0;
      local_450 = p_Var22;
      if (local_408.
          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[(long)p_Var22].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_408.
          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[(long)p_Var22].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar25 = 0;
        do {
          local_470.path_._M_dataplus._M_p._0_4_ =
               (int)((ulong)((long)iStack_4a0._M_current - (long)local_4a8) >> 2) * -0x55555555;
          local_4f0._M_dataplus._M_p._0_4_ =
               (int)((ulong)((long)(local_4f8->mode_cfg_->average_datasets).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(local_4f8->mode_cfg_->average_datasets).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 5);
          local_4d0._M_dataplus._M_p = (pointer)0x0;
          std::vector<cv::Mat_<double>,std::allocator<cv::Mat_<double>>>::
          emplace_back<int,int,double>
                    ((vector<cv::Mat_<double>,std::allocator<cv::Mat_<double>>> *)local_308,
                     (int *)&local_470,(int *)&local_4f0,(double *)&local_4d0);
          uVar25 = uVar25 + 1;
        } while (uVar25 < (ulong)((long)local_408.
                                        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[(long)p_Var22].
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_408.
                                        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[(long)p_Var22].
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      std::
      vector<std::vector<cv::Mat_<double>,std::allocator<cv::Mat_<double>>>,std::allocator<std::vector<cv::Mat_<double>,std::allocator<cv::Mat_<double>>>>>
      ::emplace_back<std::vector<cv::Mat_<double>,std::allocator<cv::Mat_<double>>>>
                ((vector<std::vector<cv::Mat_<double>,std::allocator<cv::Mat_<double>>>,std::allocator<std::vector<cv::Mat_<double>,std::allocator<cv::Mat_<double>>>>>
                  *)local_358._M_local_buf,
                 (vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_> *)local_308);
      std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>::~vector
                ((vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_> *)local_308);
      p_Var22 = (_Base_ptr)((long)&((_Rb_tree_node_base *)&local_450->_M_color)->_M_color + 1);
    } while (p_Var22 < (_Base_ptr)
                       ((long)(local_4f8->mode_cfg_->ccl_blocksize_algorithms).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(local_4f8->mode_cfg_->ccl_blocksize_algorithms).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  pbVar12 = (local_4f8->mode_cfg_->blocksize_datasets).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pYVar32 = local_4f8;
  if ((local_4f8->mode_cfg_->blocksize_datasets).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar12) {
    local_3c8 = 0;
    do {
      local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
      pcVar1 = pbVar12[local_3c8]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4d0,pcVar1,pcVar1 + pbVar12[local_3c8]._M_string_length);
      pGVar3 = pYVar32->glob_cfg_;
      filesystem::path::path((path *)&local_4f0,&local_4d0);
      pcVar1 = (pGVar3->input_path).path_._M_dataplus._M_p;
      local_308 = (undefined1  [8])local_2f8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_308,pcVar1,pcVar1 + (pGVar3->input_path).path_._M_string_length);
      ppVar8 = filesystem::path::operator/=((path *)local_308,(path *)&local_4f0);
      local_470.path_._M_dataplus._M_p = (pointer)&local_470.path_.field_2;
      pcVar1 = (ppVar8->path_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_470,pcVar1,pcVar1 + (ppVar8->path_)._M_string_length);
      if (local_308 != (undefined1  [8])local_2f8) {
        operator_delete((void *)local_308,local_2f8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
        operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
      }
      filesystem::path::path(&local_428,&pYVar32->glob_cfg_->input_txt);
      local_308 = (undefined1  [8])local_2f8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_308,local_470.path_._M_dataplus._M_p,
                 local_470.path_._M_dataplus._M_p + local_470.path_._M_string_length);
      ppVar8 = filesystem::path::operator/=((path *)local_308,&local_428);
      local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
      pcVar1 = (ppVar8->path_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4f0,pcVar1,pcVar1 + (ppVar8->path_)._M_string_length);
      if (local_308 != (undefined1  [8])local_2f8) {
        operator_delete((void *)local_308,local_2f8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428.path_._M_dataplus._M_p != &local_428.path_.field_2) {
        operator_delete(local_428.path_._M_dataplus._M_p,
                        local_428.path_.field_2._M_allocated_capacity + 1);
      }
      pMVar10 = pYVar32->mode_cfg_;
      pcVar1 = (pYVar32->glob_cfg_->glob_output_path).path_._M_dataplus._M_p;
      local_308 = (undefined1  [8])local_2f8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_308,pcVar1,
                 pcVar1 + (pYVar32->glob_cfg_->glob_output_path).path_._M_string_length);
      ppVar8 = filesystem::path::operator/=((path *)local_308,&pMVar10->mode_output_path);
      local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
      pcVar1 = (ppVar8->path_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_518,pcVar1,pcVar1 + (ppVar8->path_)._M_string_length);
      if (local_308 != (undefined1  [8])local_2f8) {
        operator_delete((void *)local_308,local_2f8[0]._M_allocated_capacity + 1);
      }
      pGVar3 = pYVar32->glob_cfg_;
      local_308 = (undefined1  [8])local_2f8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_308,local_518._M_dataplus._M_p,
                 local_518._M_dataplus._M_p + local_518._M_string_length);
      ppVar8 = filesystem::path::operator/=((path *)local_308,&pGVar3->latex_path);
      local_428.path_._M_dataplus._M_p = (pointer)&local_428.path_.field_2;
      pcVar1 = (ppVar8->path_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_428,pcVar1,pcVar1 + (ppVar8->path_)._M_string_length);
      if (local_308 != (undefined1  [8])local_2f8) {
        operator_delete((void *)local_308,local_2f8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_518._M_dataplus._M_p != &local_518.field_2) {
        operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
      }
      this_01 = (YacclabTests *)local_3c0;
      bVar6 = filesystem::create_directories((path *)this_01);
      if (bVar6) {
        local_3e8.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_3e8.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3e8.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar6 = LoadFileList(this_01,&local_3e8,(path *)&local_4f0);
        if (bVar6) {
          OutputBox::StartUnitaryBox
                    (&local_e0,&local_4d0,
                     (ulong)(uint)((int)((ulong)((long)local_3e8.
                                                                                                              
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)local_3e8.
                                                                                                            
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                  -0x33333333));
          if (local_3e8.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_3e8.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            local_3c0._40_8_ = SEXT48((int)local_3c8);
            uVar25 = 0;
            do {
              ProgressBar::Display(&local_e0.pb,(uint)uVar25);
              local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
              pcVar1 = local_3e8.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar25].first._M_dataplus._M_p;
              local_318 = uVar25;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_518,pcVar1,
                         pcVar1 + local_3e8.
                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar25].first.
                                  _M_string_length);
              filesystem::path::path((path *)&local_448,&local_518);
              local_308 = (undefined1  [8])local_2f8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_308,local_470.path_._M_dataplus._M_p,
                         local_470.path_._M_dataplus._M_p + local_470.path_._M_string_length);
              ppVar8 = filesystem::path::operator/=((path *)local_308,(path *)&local_448);
              local_490 = local_480;
              pcVar1 = (ppVar8->path_)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_490,pcVar1,pcVar1 + (ppVar8->path_)._M_string_length);
              if (local_308 != (undefined1  [8])local_2f8) {
                operator_delete((void *)local_308,local_2f8[0]._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_448._M_dataplus._M_p != &local_448.field_2) {
                operator_delete(local_448._M_dataplus._M_p,
                                local_448.field_2._M_allocated_capacity + 1);
              }
              pLVar11 = LabelingMapSingleton::GetLabeling
                                  ((pYVar32->mode_cfg_->ccl_blocksize_algorithms).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
              iVar24 = (*pLVar11->_vptr_Labeling[9])(pLVar11);
              local_308 = (undefined1  [8])local_2f8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_308,local_490,local_488 + (long)local_490);
              cVar7 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar24) + 0x20))
                                ((long *)CONCAT44(extraout_var,iVar24),(string *)local_308);
              if (local_308 != (undefined1  [8])local_2f8) {
                operator_delete((void *)local_308,local_2f8[0]._M_allocated_capacity + 1);
              }
              if (cVar7 == '\0') {
                std::operator+(&local_448,"Unable to open \'",&local_518);
                pYVar32 = local_4f8;
                plVar16 = (long *)std::__cxx11::string::append((char *)&local_448);
                paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(plVar16 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar16 == paVar20) {
                  local_2f8[0]._0_8_ = paVar20->_M_allocated_capacity;
                  local_2f8[0]._8_8_ = plVar16[3];
                  local_308 = (undefined1  [8])local_2f8;
                }
                else {
                  local_2f8[0]._0_8_ = paVar20->_M_allocated_capacity;
                  local_308 = (undefined1  [8])*plVar16;
                }
                pGStack_300 = (GlobalConfig *)plVar16[1];
                *plVar16 = (long)paVar20;
                plVar16[1] = 0;
                *(undefined1 *)(plVar16 + 2) = 0;
                OutputBox::Cmessage(&local_e0,(string *)local_308);
                if (local_308 != (undefined1  [8])local_2f8) {
                  operator_delete((void *)local_308,local_2f8[0]._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_448._M_dataplus._M_p != &local_448.field_2) {
                  operator_delete(local_448._M_dataplus._M_p,
                                  local_448.field_2._M_allocated_capacity + 1);
                }
              }
              else {
                pbVar12 = (local_4f8->mode_cfg_->ccl_blocksize_algorithms).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pYVar32 = local_4f8;
                if ((local_4f8->mode_cfg_->ccl_blocksize_algorithms).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish != pbVar12) {
                  uVar25 = 0;
                  lVar31 = local_3c0._40_8_;
                  do {
                    local_308 = (undefined1  [8])local_2f8;
                    pcVar1 = pbVar12[uVar25]._M_dataplus._M_p;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)local_308,pcVar1,pcVar1 + pbVar12[uVar25]._M_string_length)
                    ;
                    local_3c0._32_8_ = uVar25;
                    pLVar11 = LabelingMapSingleton::GetLabeling((string *)local_308);
                    if (iStack_4a0._M_current != local_4a8) {
                      this_00 = &(pLVar11->perf_).counters_;
                      local_450 = &(pLVar11->perf_).counters_._M_t._M_impl.super__Rb_tree_header.
                                   _M_header;
                      local_4b0 = 0;
                      local_310 = pLVar11;
                      do {
                        uVar4 = local_3c0._32_8_;
                        local_448._M_dataplus._M_p = (pointer)0x7fefffffffffffff;
                        std::vector<double,_std::allocator<double>_>::vector
                                  (&local_370,
                                   (long)local_408.
                                         super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[local_3c0._32_8_]
                                         .
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_408.
                                         super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[local_3c0._32_8_]
                                         .
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 5,
                                   (value_type_conflict5 *)&local_448,
                                   (allocator_type *)(local_3c0 + 0x30));
                        if (pYVar32->mode_cfg_->blocksize_tests_number != 0) {
                          uVar19 = 0;
                          do {
                            local_3f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)CONCAT44(local_3f0._4_4_,uVar19);
                            std::
                            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PerformanceEvaluator::Elapsed>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PerformanceEvaluator::Elapsed>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PerformanceEvaluator::Elapsed>_>_>
                            ::clear(&this_00->_M_t);
                            (*pLVar11->_vptr_Labeling[0xb])
                                      (pLVar11,(ulong)(uint)local_4a8[local_4b0]._M_elems[0],
                                       (ulong)(uint)local_4a8[local_4b0]._M_elems[1],
                                       (ulong)(uint)local_4a8[local_4b0]._M_elems[2]);
                            pbVar12 = local_408.
                                      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar4].
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                            if (local_408.
                                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar4].
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish != pbVar12) {
                              lVar31 = 0;
                              uVar25 = 0;
                              do {
                                __k = (key_type *)((long)&(pbVar12->_M_dataplus)._M_p + lVar31);
                                cVar13 = std::
                                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PerformanceEvaluator::Elapsed>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PerformanceEvaluator::Elapsed>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PerformanceEvaluator::Elapsed>_>_>
                                         ::find(&this_00->_M_t,__k);
                                pdVar5 = local_370.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start;
                                if (cVar13._M_node != local_450) {
                                  pmVar14 = std::
                                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PerformanceEvaluator::Elapsed,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PerformanceEvaluator::Elapsed>_>_>
                                            ::at(this_00,__k);
                                  dVar33 = pmVar14->total;
                                  if (pdVar5[uVar25] <= pmVar14->total) {
                                    dVar33 = pdVar5[uVar25];
                                  }
                                  local_370.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar25] = dVar33;
                                }
                                uVar25 = uVar25 + 1;
                                pbVar12 = local_408.
                                          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar4].
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start;
                                lVar31 = lVar31 + 0x20;
                              } while (uVar25 < (ulong)((long)local_408.
                                                                                                                            
                                                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar4].
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)pbVar12 >> 5));
                            }
                            pLVar11 = local_310;
                            (*local_310->_vptr_Labeling[5])();
                            uVar19 = (int)local_3f0 + 1;
                            lVar31 = local_3c0._40_8_;
                            pYVar32 = local_4f8;
                          } while (uVar19 < local_4f8->mode_cfg_->blocksize_tests_number);
                        }
                        lVar15 = (long)local_408.
                                       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar4].
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_408.
                                       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar4].
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                        if (lVar15 != 0) {
                          lVar15 = lVar15 >> 5;
                          puVar23 = (undefined8 *)
                                    (*(long *)(local_358._M_allocated_capacity + uVar4 * 0x18) +
                                    0x48);
                          lVar27 = 0;
                          do {
                            lVar28 = *(long *)*puVar23 * (long)(int)local_4b0 + puVar23[-7];
                            *(double *)(lVar28 + lVar31 * 8) =
                                 (double)(~-(ulong)(local_370.
                                                                                                        
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar27]
                                                  == 1.79769313486232e+308) &
                                         (ulong)local_370.
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_start[lVar27]) +
                                 *(double *)(lVar28 + lVar31 * 8);
                            lVar27 = lVar27 + 1;
                            puVar23 = puVar23 + 0xc;
                          } while (lVar15 + (ulong)(lVar15 == 0) != lVar27);
                        }
                        if (local_370.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start != (pointer)0x0) {
                          operator_delete(local_370.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start,
                                          (long)local_370.
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_370.
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_start);
                        }
                        local_4b0 = (ulong)((int)local_4b0 + 1);
                        uVar25 = ((long)iStack_4a0._M_current - (long)local_4a8 >> 2) *
                                 -0x5555555555555555;
                      } while (local_4b0 <= uVar25 && uVar25 - local_4b0 != 0);
                    }
                    if (local_308 != (undefined1  [8])local_2f8) {
                      operator_delete((void *)local_308,local_2f8[0]._M_allocated_capacity + 1);
                    }
                    uVar25 = (ulong)((int)local_3c0._32_8_ + 1);
                    pbVar12 = (pYVar32->mode_cfg_->ccl_blocksize_algorithms).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                  } while (uVar25 < (ulong)((long)(pYVar32->mode_cfg_->ccl_blocksize_algorithms).
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)pbVar12 >> 5));
                }
              }
              if (local_490 != local_480) {
                operator_delete(local_490,local_480[0] + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_518._M_dataplus._M_p != &local_518.field_2) {
                operator_delete(local_518._M_dataplus._M_p,
                                local_518.field_2._M_allocated_capacity + 1);
              }
              uVar25 = (ulong)((int)local_318 + 1);
              uVar17 = ((long)local_3e8.
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_3e8.
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
            } while (uVar25 <= uVar17 && uVar17 - uVar25 != 0);
          }
          ProgressBar::End(&local_e0.pb);
          OutputBox::PrintSeparatorLine(&local_e0);
        }
        else {
          local_490 = local_480;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_490,local_4f0._M_dataplus._M_p,
                     local_4f0._M_dataplus._M_p + local_4f0._M_string_length);
          plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_490,0,(char *)0x0,0x311cf4);
          local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
          psVar21 = (size_type *)(plVar16 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar16 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar21) {
            local_518.field_2._M_allocated_capacity = *psVar21;
            local_518.field_2._8_8_ = plVar16[3];
          }
          else {
            local_518.field_2._M_allocated_capacity = *psVar21;
            local_518._M_dataplus._M_p = (pointer)*plVar16;
          }
          local_518._M_string_length = plVar16[1];
          *plVar16 = (long)psVar21;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          plVar16 = (long *)std::__cxx11::string::append((char *)&local_518);
          paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar16 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar16 == paVar20) {
            local_2f8[0]._0_8_ = paVar20->_M_allocated_capacity;
            local_2f8[0]._8_8_ = plVar16[3];
            local_308 = (undefined1  [8])local_2f8;
          }
          else {
            local_2f8[0]._0_8_ = paVar20->_M_allocated_capacity;
            local_308 = (undefined1  [8])*plVar16;
          }
          pGStack_300 = (GlobalConfig *)plVar16[1];
          *plVar16 = (long)paVar20;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          OutputBox::Cwarning(&local_e0,(string *)local_308,&local_4d0);
          if (local_308 != (undefined1  [8])local_2f8) {
            operator_delete((void *)local_308,local_2f8[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_518._M_dataplus._M_p != &local_518.field_2) {
            operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
          }
          if (local_490 != local_480) {
            operator_delete(local_490,local_480[0] + 1);
          }
        }
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
        ::~vector(&local_3e8);
      }
      else {
        local_490 = local_480;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_490,local_3c0._0_8_,(pointer)(local_3c0._8_8_ + local_3c0._0_8_)
                  );
        plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_490,0,(char *)0x0,0x312604);
        local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
        psVar21 = (size_type *)(plVar16 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar16 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar21) {
          local_518.field_2._M_allocated_capacity = *psVar21;
          local_518.field_2._8_8_ = plVar16[3];
        }
        else {
          local_518.field_2._M_allocated_capacity = *psVar21;
          local_518._M_dataplus._M_p = (pointer)*plVar16;
        }
        local_518._M_string_length = plVar16[1];
        *plVar16 = (long)psVar21;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_518);
        paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar16 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar16 == paVar20) {
          local_2f8[0]._0_8_ = paVar20->_M_allocated_capacity;
          local_2f8[0]._8_8_ = plVar16[3];
          local_308 = (undefined1  [8])local_2f8;
        }
        else {
          local_2f8[0]._0_8_ = paVar20->_M_allocated_capacity;
          local_308 = (undefined1  [8])*plVar16;
        }
        pGStack_300 = (GlobalConfig *)plVar16[1];
        *plVar16 = (long)paVar20;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        OutputBox::Cwarning(&local_e0,(string *)local_308,&local_4d0);
        if (local_308 != (undefined1  [8])local_2f8) {
          operator_delete((void *)local_308,local_2f8[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_518._M_dataplus._M_p != &local_518.field_2) {
          operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
        }
        if (local_490 != local_480) {
          operator_delete(local_490,local_480[0] + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428.path_._M_dataplus._M_p != &local_428.path_.field_2) {
        operator_delete(local_428.path_._M_dataplus._M_p,
                        local_428.path_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
        operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470.path_._M_dataplus._M_p != &local_470.path_.field_2) {
        operator_delete(local_470.path_._M_dataplus._M_p,
                        local_470.path_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
        operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
      }
      local_3c8 = (ulong)((int)local_3c8 + 1);
      pbVar12 = (pYVar32->mode_cfg_->blocksize_datasets).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (local_3c8 <
             (ulong)((long)(pYVar32->mode_cfg_->blocksize_datasets).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12 >> 5));
  }
  pMVar10 = pYVar32->mode_cfg_;
  if ((pMVar10->ccl_blocksize_algorithms).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pMVar10->ccl_blocksize_algorithms).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_3f0 = _VTT;
    local_4b0 = _operator__;
    p_Var22 = (_Base_ptr)0x0;
    do {
      pbVar12 = (pMVar10->ccl_blocksize_algorithms).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pcVar1 = pbVar12[(long)p_Var22]._M_dataplus._M_p;
      local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_518,pcVar1,pcVar1 + pbVar12[(long)p_Var22]._M_string_length);
      std::__cxx11::string::append((char *)&local_518);
      filesystem::path::path(&local_428,&local_518);
      local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4d0,local_3c0._0_8_,(pointer)(local_3c0._8_8_ + local_3c0._0_8_));
      ppVar8 = filesystem::path::operator/=((path *)&local_4d0,&local_428);
      local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
      pcVar1 = (ppVar8->path_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4f0,pcVar1,pcVar1 + (ppVar8->path_)._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
        operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
      }
      local_470.path_._M_dataplus._M_p = (pointer)&local_470.path_.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_470,local_4f0._M_dataplus._M_p,
                 local_4f0._M_dataplus._M_p + local_4f0._M_string_length);
      std::ofstream::ofstream((ostream *)local_308,(string *)&local_470,_S_out);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470.path_._M_dataplus._M_p != &local_470.path_.field_2) {
        operator_delete(local_470.path_._M_dataplus._M_p,
                        local_470.path_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
        operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428.path_._M_dataplus._M_p != &local_428.path_.field_2) {
        operator_delete(local_428.path_._M_dataplus._M_p,
                        local_428.path_.field_2._M_allocated_capacity + 1);
      }
      local_450 = p_Var22;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_518._M_dataplus._M_p != &local_518.field_2) {
        operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_308,",,Kernel",8);
      p_Var22 = local_450;
      pbVar2 = local_408.
               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)local_450].
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar12 = local_408.
                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(long)local_450].
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar2;
          pbVar12 = pbVar12 + 1) {
        if ((local_4f8->mode_cfg_->blocksize_datasets).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (local_4f8->mode_cfg_->blocksize_datasets).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar25 = 0;
          do {
            local_4d0._M_dataplus._M_p._0_1_ = 0x2c;
            poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_308,(char *)&local_4d0,1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar18,(pbVar12->_M_dataplus)._M_p,pbVar12->_M_string_length);
            uVar25 = uVar25 + 1;
          } while (uVar25 < (ulong)((long)(local_4f8->mode_cfg_->blocksize_datasets).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(local_4f8->mode_cfg_->blocksize_datasets).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_308,"\nX,Y,Z",6);
      if (local_408.
          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[(long)p_Var22].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_408.
          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[(long)p_Var22].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar25 = 0;
        do {
          pbVar2 = (local_4f8->mode_cfg_->blocksize_datasets).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pbVar12 = (local_4f8->mode_cfg_->blocksize_datasets).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar2;
              pbVar12 = pbVar12 + 1) {
            local_4d0._M_dataplus._M_p._0_1_ = 0x2c;
            poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_308,(char *)&local_4d0,1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar18,(pbVar12->_M_dataplus)._M_p,pbVar12->_M_string_length);
          }
          uVar25 = uVar25 + 1;
        } while (uVar25 < (ulong)((long)local_408.
                                        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[(long)p_Var22].
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_408.
                                        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[(long)p_Var22].
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_308,"\n",1);
      if (iStack_4a0._M_current != local_4a8) {
        uVar25 = 0;
        do {
          poVar18 = (ostream *)
                    std::ostream::operator<<((ostream *)local_308,local_4a8[uVar25]._M_elems[0]);
          local_4d0._M_dataplus._M_p._0_1_ = 0x2c;
          poVar18 = std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)&local_4d0,1)
          ;
          poVar18 = (ostream *)std::ostream::operator<<(poVar18,local_4a8[uVar25]._M_elems[1]);
          local_4d0._M_dataplus._M_p._0_1_ = 0x2c;
          poVar18 = std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)&local_4d0,1)
          ;
          std::ostream::operator<<(poVar18,local_4a8[uVar25]._M_elems[2]);
          if (local_408.
              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)p_Var22].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_408.
              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)p_Var22].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            uVar17 = 0;
            do {
              if ((local_4f8->mode_cfg_->blocksize_datasets).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  (local_4f8->mode_cfg_->blocksize_datasets).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                uVar30 = 0;
                do {
                  local_4d0._M_dataplus._M_p._0_1_ = 0x2c;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_308,(char *)&local_4d0,1);
                  lVar31 = *(long *)(local_358._M_allocated_capacity + (long)p_Var22 * 0x18);
                  std::ostream::_M_insert<double>
                            (*(double *)
                              (**(long **)(lVar31 + 0x48 + uVar17 * 0x60) * uVar25 +
                               *(long *)(lVar31 + 0x10 + uVar17 * 0x60) + uVar30 * 8));
                  uVar30 = uVar30 + 1;
                } while (uVar30 < (ulong)((long)(local_4f8->mode_cfg_->blocksize_datasets).
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(local_4f8->mode_cfg_->blocksize_datasets).
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 5));
              }
              uVar17 = uVar17 + 1;
            } while (uVar17 < (ulong)((long)local_408.
                                            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[(long)p_Var22]
                                            .
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_408.
                                            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[(long)p_Var22]
                                            .
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 5));
          }
          local_4d0._M_dataplus._M_p._0_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_308,(char *)&local_4d0,1);
          uVar25 = uVar25 + 1;
          uVar17 = ((long)iStack_4a0._M_current - (long)local_4a8 >> 2) * -0x5555555555555555;
        } while (uVar25 <= uVar17 && uVar17 - uVar25 != 0);
      }
      local_308 = (undefined1  [8])local_3f0;
      *(ulong *)(local_308 + *(long *)(local_3f0->_M_local_buf + -0x18)) = local_4b0;
      std::filebuf::~filebuf((filebuf *)&pGStack_300);
      std::ios_base::~ios_base(local_210);
      p_Var22 = (_Base_ptr)((long)&((_Rb_tree_node_base *)&local_450->_M_color)->_M_color + 1);
      pMVar10 = local_4f8->mode_cfg_;
    } while (p_Var22 < (_Base_ptr)
                       ((long)(pMVar10->ccl_blocksize_algorithms).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pMVar10->ccl_blocksize_algorithms).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_408);
  std::
  vector<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>,_std::allocator<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>_>_>
  ::~vector((vector<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>,_std::allocator<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>_>_>
             *)&local_358);
  if (local_4a8 != (array<int,_3UL> *)0x0) {
    operator_delete(local_4a8,(long)local_498 - (long)local_4a8);
  }
  if ((undefined1 *)local_3c0._0_8_ != local_3c0 + 0x10) {
    operator_delete((void *)local_3c0._0_8_,local_3c0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.pb.pre_message_._M_dataplus._M_p != &local_e0.pb.pre_message_.field_2) {
    operator_delete(local_e0.pb.pre_message_._M_dataplus._M_p,
                    local_e0.pb.pre_message_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.pb.post_message_._M_dataplus._M_p != &local_e0.pb.post_message_.field_2) {
    operator_delete(local_e0.pb.post_message_._M_dataplus._M_p,
                    local_e0.pb.post_message_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.title_._M_dataplus._M_p != &local_e0.title_.field_2) {
    operator_delete(local_e0.title_._M_dataplus._M_p,
                    local_e0.title_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void YacclabTests::BlockSizeTest() {
    OutputBox ob(mode_cfg_.mode + " Block Size Test");

    path current_output_path(glob_cfg_.glob_output_path / mode_cfg_.mode_output_path / path("Blocksize"));

    // Create vector of dims (arrays of three int)
    int maxsize = 0;

#if defined YACCLAB_WITH_CUDA
    cudaDeviceProp prop;
    cudaGetDeviceProperties(&prop, 0);
    maxsize = prop.maxThreadsPerBlock;
#endif

    std::vector<std::array<int, 3>> dims;

    for (int x = mode_cfg_.blocksize_x[0]; x <= mode_cfg_.blocksize_x[1]; x += mode_cfg_.blocksize_x[2]) {
        for (int y = mode_cfg_.blocksize_y[0]; y <= mode_cfg_.blocksize_y[1]; y += mode_cfg_.blocksize_y[2]) {
            for (int z = mode_cfg_.blocksize_z[0]; z <= mode_cfg_.blocksize_z[1]; z += mode_cfg_.blocksize_z[2]) {
                if (x * y * z <= maxsize) {
                    dims.push_back({ x, y, z });
                }
            }
        }
    }

    std::vector<std::vector<cv::Mat1d>> results;					// One dims x datasets matrix for each kernel for each algorithm
    std::vector<std::vector<std::string>> header;					// Kernel names for each algorithm
    for (const auto& algo_name : mode_cfg_.ccl_blocksize_algorithms) {

        const auto& kernels = KernelMapSingleton::GetKernels(algo_name);
        header.push_back(kernels);

    }

    for (int alg = 0; alg < mode_cfg_.ccl_blocksize_algorithms.size(); ++alg) {
        std::vector<cv::Mat1d> tmp;

        for (int k = 0; k < header[alg].size(); ++k) {
            tmp.emplace_back(static_cast<int>(dims.size()), static_cast<int>(mode_cfg_.average_datasets.size()), (double)0);
        }

        results.push_back(std::move(tmp));
    }

    for (unsigned d = 0; d < mode_cfg_.blocksize_datasets.size(); ++d) { // For every dataset in the average list

        std::string dataset_name(mode_cfg_.blocksize_datasets[d]);

        path dataset_path(glob_cfg_.input_path / path(dataset_name)),
            is_path = dataset_path / path(glob_cfg_.input_txt), // files.txt path
            current_latex_path(glob_cfg_.glob_output_path / mode_cfg_.mode_output_path / glob_cfg_.latex_path);

        if (!create_directories(current_output_path)) {
            ob.Cwarning("Unable to find/create the output path '" + current_output_path.string() + "', skipped", dataset_name);
            continue;
        }

        // To save list of filename on which CLLAlgorithms must be tested
        std::vector<std::pair<std::string, bool>> filenames;  // first: filename, second: state of filename (find or not)
        if (!LoadFileList(filenames, is_path)) {
            ob.Cwarning("Unable to open '" + is_path.string() + "', skipped", dataset_name);
            continue;
        }

        // Number of files
        unsigned filenames_size = static_cast<unsigned>(filenames.size());

        // Start output message box
        ob.StartUnitaryBox(dataset_name, filenames_size);

        for (unsigned file = 0; file < filenames.size(); ++file) {

            ob.UpdateUnitaryBox(file);

            std::string filename = filenames[file].first;
            path filename_path = dataset_path / path(filename);

            // Read and load image
            if (!LabelingMapSingleton::GetLabeling(mode_cfg_.ccl_blocksize_algorithms[0])->GetInput()->ReadBinary(filename_path.string())) {
                ob.Cmessage("Unable to open '" + filename + "', skipped");
                continue;
            }

            for (unsigned alg = 0; alg < mode_cfg_.ccl_blocksize_algorithms.size(); ++alg) {

                std::string algo_name = mode_cfg_.ccl_blocksize_algorithms[alg];

                Labeling* algorithm = LabelingMapSingleton::GetLabeling(algo_name);

                for (unsigned dim = 0; dim < dims.size(); ++dim) {

                    std::vector<double> min_times(header[alg].size(), std::numeric_limits<double>::max());

                    for (unsigned it = 0; it < mode_cfg_.blocksize_tests_number; ++it) {

                        try {
                            // Perform current algorithm on current image and save result.
                            algorithm->perf_.reset_counters();
                            algorithm->PerformLabelingBlocksize(dims[dim][0], dims[dim][1], dims[dim][2]);
                        }
                        catch (const std::exception& e) {
                            algorithm->FreeLabelingData();
                            ob.Cerror("Something wrong with " + algo_name + ": " + e.what()); // You should check your algorithms' implementation before performing YACCLAB tests  
                        }

                        for (int k = 0; k < header[alg].size(); ++k) {
                            const auto& kernel = header[alg][k];

                            if (algorithm->perf_.find(kernel)) {
                                min_times[k] = std::min(min_times[k], algorithm->perf_.get_total(kernel));
                            }
                        }

                        algorithm->FreeLabelingData();
                    }

                    // For each image, execution times are summed, in order to find average
                    for (int k = 0; k < header[alg].size(); ++k) {
                        // If min time is DBL_MAX, the kernel was never run
                        results[alg][k](dim, d) += (min_times[k] == std::numeric_limits<double>::max() ? 0 : min_times[k]);
                    }

                }

            }

        } // END IMAGE FOR
        ob.StopUnitaryBox();

        // TODO: decide if values should be averaged (they are just summed for now)
        //for (auto& result_mat : results) {
        //	result_mat /= static_cast<double>(filenames.size());
        //}

    } // END DATASET FOR

    
    // Print results
    for (int alg = 0; alg < mode_cfg_.ccl_blocksize_algorithms.size(); ++alg) {

        {   // To automatically destroy ofstream os

            std::ofstream os((current_output_path / path(mode_cfg_.ccl_blocksize_algorithms[alg] + ".csv")).string());

            os << ",,Kernel";
            for (const auto& kernel : header[alg]) {
                for (int d = 0; d < mode_cfg_.blocksize_datasets.size(); ++d) {
                    os << ',' << kernel;
                }
            }
            os << "\nX,Y,Z";

            for (int k = 0; k < header[alg].size(); ++k) {
                for (const auto& dataset : mode_cfg_.blocksize_datasets) {
                    os << ',' << dataset;
                }
            }
            os << "\n";

            for (int dim = 0; dim < dims.size(); ++dim) {
                os << dims[dim][0] << ',' << dims[dim][1] << ',' << dims[dim][2];
                for (int k = 0; k < header[alg].size(); ++k) {
                    for (int d = 0; d < mode_cfg_.blocksize_datasets.size(); ++d) {
                        os << ',' << results[alg][k](dim, d);
                    }
                }
                os << '\n';
            }

        }
    }

}